

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O1

void soul::HTMLGenerator::addMarkdownAsHTML
               (HTMLElement *parent,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines)

{
  byte bVar1;
  char cVar2;
  pointer pcVar3;
  HTMLElement *pHVar4;
  pointer pHVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  int iVar7;
  HTMLElement **ppHVar8;
  HTMLElement *pHVar9;
  size_type *psVar10;
  long lVar11;
  undefined1 *puVar12;
  pointer pbVar13;
  undefined8 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  HTMLElement *pHVar17;
  _Alloc_hider _Var18;
  pointer pbVar19;
  bool bVar20;
  string_view value;
  string_view text;
  string_view value_00;
  string_view text_00;
  string_view value_01;
  string_view markdown;
  string_view markdown_00;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> content;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paragraphs;
  string local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  ListLevel *local_218;
  pointer local_210;
  HTMLElement *local_208;
  undefined1 local_200 [32];
  HTMLElement *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  size_t local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  pointer local_1a8;
  HTMLElement *local_1a0;
  undefined1 local_198 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  HTMLElement *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  string local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  pointer local_80;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_200._16_8_ = parent;
  groupMarkdownIntoParagraphs(&local_48,lines);
  local_228._M_allocated_capacity = 0;
  local_228._8_8_ = (ListLevel *)0x0;
  local_218 = (ListLevel *)0x0;
  local_80 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar19 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar3 = (pbVar19->_M_dataplus)._M_p;
      local_1a8 = (pointer)local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,pcVar3,pcVar3 + pbVar19->_M_string_length);
      local_210 = (pointer)local_200;
      if (local_1a0 == (HTMLElement *)0x0) {
LAB_0026e3d3:
        ppHVar8 = &local_208;
        pbVar13 = (pointer)local_200;
      }
      else {
        bVar1 = *(byte *)&(local_1a8->_M_dataplus)._M_p;
        if ((bVar1 - 9 < 5) || (bVar1 == 0x20)) {
          if (local_1a0 != (HTMLElement *)0x1) {
            puVar12 = (undefined1 *)
                      ((long)&local_1a0[-1].children.
                              super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
            pbVar13 = local_1a8;
            do {
              pbVar13 = (pointer)((long)&(pbVar13->_M_dataplus)._M_p + 1);
              if ((4 < *(byte *)pbVar13 - 9) && (*(byte *)pbVar13 != 0x20)) {
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          ((string *)&local_210,pbVar13,
                           (undefined1 *)
                           ((long)&(local_1a8->_M_dataplus)._M_p +
                           (long)&(local_1a0->name)._M_dataplus));
                goto LAB_0026e3f2;
              }
              puVar12 = puVar12 + -1;
            } while (puVar12 != (undefined1 *)0x0);
          }
          goto LAB_0026e3d3;
        }
        if (local_1a8 == (pointer)local_198) {
          local_200._8_8_ = local_198._8_8_;
        }
        else {
          local_210 = local_1a8;
        }
        local_200._0_8_ = local_198._0_8_;
        ppHVar8 = &local_1a0;
        pbVar13 = (pointer)local_198;
        local_208 = local_1a0;
        local_1a8 = (pointer)local_198;
      }
      *ppHVar8 = (HTMLElement *)0x0;
      *(undefined1 *)&(pbVar13->_M_dataplus)._M_p = 0;
LAB_0026e3f2:
      if (local_1a8 != (pointer)local_198) {
        operator_delete(local_1a8,(ulong)(local_198._0_8_ + 1));
      }
      uVar16 = pbVar19->_M_string_length - (long)local_208;
      if ((local_208 < (HTMLElement *)0x2) ||
         (((cVar2 = *(char *)&(local_210->_M_dataplus)._M_p, cVar2 != '-' && (cVar2 != '*')) ||
          (*(char *)((long)&(local_210->_M_dataplus)._M_p + 1) != ' ')))) {
        if (local_228._8_8_ != local_228._M_allocated_capacity) {
          local_228._8_8_ = local_228._M_allocated_capacity;
        }
        if ((local_208 < (HTMLElement *)0x3) ||
           (*(char *)((long)&(local_210->_M_dataplus)._M_p + 2) != '`' ||
            *(short *)&(local_210->_M_dataplus)._M_p != 0x6060)) {
          if (uVar16 < 4) {
            if (local_208 != (HTMLElement *)0x0) {
              pHVar9 = (HTMLElement *)local_200._16_8_;
              if (local_228._M_allocated_capacity != local_228._8_8_) {
                pHVar9 = ((ListLevel *)(local_228._8_8_ + -0x10))->ul;
              }
              uVar14 = local_228._M_allocated_capacity;
              pHVar9 = choc::html::HTMLElement::addParagraph(pHVar9);
              markdown._M_str = (char *)uVar14;
              markdown._M_len = (size_t)local_210;
              appendSpansForContent((HTMLGenerator *)pHVar9,local_208,markdown);
            }
          }
          else {
            pHVar9 = (HTMLElement *)local_200._16_8_;
            if (local_228._M_allocated_capacity != local_228._8_8_) {
              pHVar9 = ((ListLevel *)(local_228._8_8_ + -0x10))->ul;
            }
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"code","");
            std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
            emplace_back<std::__cxx11::string>
                      ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                       &pHVar9->children,&local_c0);
            value._M_str = "unspecified_code";
            value._M_len = 0x10;
            pHVar17 = choc::html::HTMLElement::setClass
                                ((pHVar9->children).
                                 super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + -1,value);
            pHVar17->contentIsInline = true;
            local_200._24_8_ = &local_1d8;
            pcVar3 = (pbVar19->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_200 + 0x18),pcVar3,pcVar3 + pbVar19->_M_string_length);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            for (pHVar9 = local_1e0; pHVar9 != (HTMLElement *)0x0;
                pHVar9 = (HTMLElement *)
                         ((long)&pHVar9[-1].children.
                                 super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
              if ((4 < ((byte *)(local_200._24_8_ + -1))[(long)pHVar9] - 9) &&
                 (((byte *)(local_200._24_8_ + -1))[(long)pHVar9] != 0x20)) {
                *(byte *)((long)&(pHVar9->name)._M_dataplus._M_p + local_200._24_8_) = 0;
                paVar15 = &local_1d8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200._24_8_ == paVar15) {
                  local_248.field_2._8_8_ = local_1d8._8_8_;
                }
                else {
                  local_248._M_dataplus._M_p = (pointer)local_200._24_8_;
                }
                local_248.field_2._M_allocated_capacity = local_1d8._M_allocated_capacity;
                psVar10 = (size_type *)&local_1e0;
                local_248._M_string_length = (size_type)pHVar9;
                local_200._24_8_ = paVar15;
                local_1e0 = pHVar9;
                goto LAB_0026e62f;
              }
            }
            psVar10 = &local_248._M_string_length;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p;
LAB_0026e62f:
            *psVar10 = 0;
            paVar15->_M_local_buf[0] = 0;
            text._M_str = local_248._M_dataplus._M_p;
            text._M_len = local_248._M_string_length;
            choc::html::HTMLElement::addContent(pHVar17,text);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._24_8_ != &local_1d8) {
              operator_delete((void *)local_200._24_8_,local_1d8._M_allocated_capacity + 1);
            }
            uVar14 = local_c0.field_2._M_allocated_capacity;
            _Var18._M_p = local_c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_0026ecb1;
          }
        }
        else {
          lVar11 = std::__cxx11::string::find((char)&local_210,10);
          if (lVar11 != -1) {
            std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_210);
            choc::text::trim(&local_248,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&local_210);
            pHVar9 = (HTMLElement *)local_200._16_8_;
            if (local_228._M_allocated_capacity != local_228._8_8_) {
              pHVar9 = ((ListLevel *)(local_228._8_8_ + -0x10))->ul;
            }
            local_a0._M_allocated_capacity = (size_type)&local_90;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"code","");
            std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
            emplace_back<std::__cxx11::string>
                      ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                       &pHVar9->children,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a0);
            pHVar5 = (pHVar9->children).
                     super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pHVar5[-1].contentIsInline = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_allocated_capacity != &local_90) {
              operator_delete((void *)local_a0._M_allocated_capacity,
                              local_90._M_allocated_capacity + 1);
            }
            pHVar9 = pHVar5 + -1;
            iVar7 = std::__cxx11::string::compare((char *)&local_248);
            if (iVar7 == 0) {
              value_01._M_str = "hljs";
              value_01._M_len = 4;
              choc::html::HTMLElement::setClass(pHVar9,value_01);
              local_168._M_allocated_capacity = (size_type)&local_158;
              local_168._8_8_ = 0;
              local_158._M_local_buf[0] = '\0';
              if (local_1c8 == &local_1b8) {
                local_100.field_2._8_8_ = local_1b8._8_8_;
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              }
              else {
                local_100._M_dataplus._M_p = (pointer)local_1c8;
              }
              local_100.field_2._M_allocated_capacity._1_7_ = local_1b8._M_allocated_capacity._1_7_;
              local_100.field_2._M_local_buf[0] = local_1b8._M_local_buf[0];
              local_100._M_string_length = local_1c0;
              local_1c0 = 0;
              local_1b8._M_local_buf[0] = '\0';
              local_1c8 = &local_1b8;
              CodeLocation::createFromString
                        ((CodeLocation *)&local_58,(string *)&local_168,&local_100);
              local_128._8_8_ = 0;
              pcStack_110 = std::
                            _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:802:67)>
                            ::_M_invoke;
              local_118 = std::
                          _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:802:67)>
                          ::_M_manager;
              local_128._M_unused._M_object = pHVar9;
              SourceCodeUtilities::iterateSyntaxTokens
                        ((CodeLocation *)&local_58,
                         (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)&local_128);
              if (local_118 != (code *)0x0) {
                (*local_118)(&local_128,&local_128,__destroy_functor);
              }
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                        ((SourceCodeText *)local_58._M_allocated_capacity);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_allocated_capacity != &local_158) {
                operator_delete((void *)local_168._M_allocated_capacity,
                                CONCAT71(local_158._M_allocated_capacity._1_7_,
                                         local_158._M_local_buf[0]) + 1);
              }
            }
            else {
              value_00._M_str = "unspecified_code";
              value_00._M_len = 0x10;
              pHVar9 = choc::html::HTMLElement::setClass(pHVar9,value_00);
              text_00._M_str = (char *)local_1c8;
              text_00._M_len = local_1c0;
              choc::html::HTMLElement::addContent(pHVar9,text_00);
            }
            if (local_1c8 != &local_1b8) {
              operator_delete(local_1c8,
                              CONCAT71(local_1b8._M_allocated_capacity._1_7_,
                                       local_1b8._M_local_buf[0]) + 1);
            }
            uVar14 = local_248.field_2._M_allocated_capacity;
            _Var18._M_p = local_248._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p == &local_248.field_2) goto LAB_0026ecb9;
            goto LAB_0026ecb1;
          }
        }
      }
      else {
        pHVar17 = (HTMLElement *)(uVar16 + 1);
        bVar20 = local_228._M_allocated_capacity == local_228._8_8_;
        pHVar9 = (HTMLElement *)local_200._16_8_;
        if (bVar20) {
LAB_0026e92b:
          local_e0._M_allocated_capacity = (size_type)&local_d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ul","");
          std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
          emplace_back<std::__cxx11::string>
                    ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                     &pHVar9->children,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0)
          ;
          local_248._M_dataplus._M_p =
               (pointer)((pHVar9->children).
                         super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
          local_248._M_string_length = (size_type)pHVar17;
          if ((ListLevel *)local_228._8_8_ == local_218) {
            std::
            vector<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel,std::allocator<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel>>
            ::
            _M_realloc_insert<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel>
                      ((vector<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel,std::allocator<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel>>
                        *)local_228._M_local_buf,(iterator)local_228._8_8_,(ListLevel *)&local_248);
          }
          else {
            *(pointer *)local_228._8_8_ = local_248._M_dataplus._M_p;
            *(HTMLElement **)(local_228._8_8_ + 8) = pHVar17;
            local_228._8_8_ = local_228._8_8_ + 0x10;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_allocated_capacity != &local_d0) {
            operator_delete((void *)local_e0._M_allocated_capacity,
                            local_d0._M_allocated_capacity + 1);
          }
        }
        else {
          pHVar4 = *(HTMLElement **)(local_228._8_8_ + -8);
          while (pHVar17 < pHVar4) {
            bVar20 = (ListLevel *)(local_228._8_8_ + -0x10) ==
                     (ListLevel *)local_228._M_allocated_capacity;
            if (bVar20) {
              local_228._8_8_ = local_228._8_8_ + -0x10;
              goto LAB_0026e92b;
            }
            pHVar4 = (HTMLElement *)((ListLevel *)(local_228._8_8_ + -0x20))->indent;
            local_228._8_8_ = (ListLevel *)(local_228._8_8_ + -0x10);
          }
          if (bVar20) goto LAB_0026e92b;
          if ((HTMLElement *)((ListLevel *)(local_228._8_8_ + -0x10))->indent < pHVar17) {
            pHVar9 = ((ListLevel *)(local_228._8_8_ + -0x10))->ul;
            goto LAB_0026e92b;
          }
        }
        pHVar9 = ((ListLevel *)(local_228._8_8_ + -0x10))->ul;
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_198 + 0x10),"li","");
        std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
        emplace_back<std::__cxx11::string>
                  ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                   &pHVar9->children,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_198 + 0x10));
        pHVar5 = (pHVar9->children).
                 super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_210);
        paVar15 = &local_248.field_2;
        local_248._M_dataplus._M_p = (pointer)paVar15;
        if (local_140 == (HTMLElement *)0x0) {
          psVar10 = &local_248._M_string_length;
        }
        else if (((byte)local_148->_M_local_buf[0] - 9 < 5) || (local_148->_M_local_buf[0] == 0x20))
        {
          if (local_140 != (HTMLElement *)0x1) {
            puVar12 = (undefined1 *)
                      ((long)&local_140[-1].children.
                              super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
            paVar6 = local_148;
            do {
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((long)paVar6 + 1);
              bVar1 = paVar6->_M_local_buf[0];
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(ulong)bVar1;
              if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
                local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          ((string *)&local_248,paVar6,
                           (byte *)((long)&(local_140->name)._M_dataplus._M_p + (long)local_148));
                goto LAB_0026ea79;
              }
              puVar12 = puVar12 + -1;
            } while (puVar12 != (undefined1 *)0x0);
          }
          psVar10 = &local_248._M_string_length;
          paVar15 = &local_248.field_2;
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        }
        else {
          if (local_148 == &local_138) {
            local_248.field_2._8_8_ = local_138._8_8_;
          }
          else {
            local_248._M_dataplus._M_p = (pointer)local_148;
          }
          local_248.field_2._M_allocated_capacity = local_138._M_allocated_capacity;
          psVar10 = (size_type *)&local_140;
          paVar15 = &local_138;
          local_248._M_string_length = (size_type)local_140;
          local_148 = &local_138;
        }
        *psVar10 = 0;
        paVar15->_M_local_buf[0] = 0;
LAB_0026ea79:
        markdown_00._M_str = (char *)paVar15;
        markdown_00._M_len = (size_t)local_248._M_dataplus._M_p;
        appendSpansForContent
                  ((HTMLGenerator *)(pHVar5 + -1),(HTMLElement *)local_248._M_string_length,
                   markdown_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if (local_148 != &local_138) {
          operator_delete(local_148,local_138._M_allocated_capacity + 1);
        }
        uVar14 = local_188.field_2._M_allocated_capacity;
        _Var18._M_p = local_188._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
LAB_0026ecb1:
          operator_delete(_Var18._M_p,uVar14 + 1);
        }
      }
LAB_0026ecb9:
      if (local_210 != (pointer)local_200) {
        operator_delete(local_210,(ulong)(local_200._0_8_ + 1));
      }
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 != local_80);
  }
  if ((ListLevel *)local_228._M_allocated_capacity != (ListLevel *)0x0) {
    operator_delete((void *)local_228._M_allocated_capacity,(long)local_218 - local_228._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

static void addMarkdownAsHTML (choc::html::HTMLElement& parent, const std::vector<std::string>& lines)
    {
        auto paragraphs = groupMarkdownIntoParagraphs (lines);

        struct ListLevel
        {
            choc::html::HTMLElement& ul;
            size_t indent;
        };

        std::vector<ListLevel> listStack;

        auto getParent = [&] () -> choc::html::HTMLElement& { return listStack.empty() ? parent : listStack.back().ul; };

        for (auto& paragraph : paragraphs)
        {
            auto trimmed = choc::text::trimStart (paragraph);
            auto leadingSpaces = paragraph.length() - trimmed.length();

            if (isListMarker (trimmed))
            {
                auto indent = 1 + leadingSpaces;

                while (! listStack.empty() && listStack.back().indent > indent)
                    listStack.pop_back();

                if (listStack.empty() || listStack.back().indent < indent)
                    listStack.push_back ({ getParent().addChild ("ul"), indent });

                appendSpansForContent (listStack.back().ul.addChild ("li"),
                                       choc::text::trimStart (trimmed.substr (2)));
                continue;
            }

            listStack.clear();

            if (choc::text::startsWith (trimmed, "```"))
            {
                auto endOfLine1 = trimmed.find ('\n');

                if (endOfLine1 != std::string::npos)
                {
                    auto type = choc::text::trim (trimmed.substr (3, endOfLine1 - 3));

                    if (endOfLine1 < trimmed.length() - 1)
                        ++endOfLine1;

                    auto content = trimmed.substr (endOfLine1);
                    auto& code = getParent().addChild ("code").setInline (true);

                    if (type == "soul")
                    {
                        code.setClass ("hljs");

                        SourceCodeUtilities::iterateSyntaxTokens (CodeLocation::createFromString ({}, std::move (content)),
                                                                  [&] (std::string_view token, std::string_view cssClass) -> bool
                        {
                            if (cssClass.empty())
                                code.addContent (token);
                            else
                                code.addSpan (cssClass).addContent (token);

                            return true;
                        });
                    }
                    else
                    {
                        code.setClass ("unspecified_code").addContent (content);
                    }
                }

                continue;
            }

            if (leadingSpaces >= 4)
            {
                getParent().addChild ("code").setClass ("unspecified_code").setInline (true)
                    .addContent (choc::text::trimEnd (paragraph));

                continue;
            }

            if (! trimmed.empty())
                appendSpansForContent (getParent().addParagraph(), trimmed);
        }
    }